

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O2

void test_ADynArray_appendArray_failure_nullptrDestArray_fn(int _i)

{
  bool bVar1;
  size_t sVar2;
  int line;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  bVar1 = private_ACUtils_ADynArray_insertArray((void *)0x0,0,"012",3,1);
  if (bVar1 == false) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x592);
    if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x593);
      return;
    }
    pcVar5 = "0";
    pcVar3 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
    pcVar4 = "private_ACUtilsTest_ADynArray_reallocCount";
    line = 0x593;
    sVar2 = private_ACUtilsTest_ADynArray_reallocCount;
  }
  else {
    sVar2 = (size_t)bVar1;
    pcVar5 = "false";
    pcVar3 = 
    "private_ACUtils_ADynArray_insertArray(arrayPtr, 0, \"012\", 3, sizeof(*(arrayPtr)->buffer)) == false"
    ;
    pcVar4 = 
    "private_ACUtils_ADynArray_insertArray(arrayPtr, 0, \"012\", 3, sizeof(*(arrayPtr)->buffer))";
    line = 0x592;
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,line,"Assertion \'_ck_x == _ck_y\' failed",
                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",pcVar3,pcVar4,sVar2,pcVar5,0,0);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_appendArray_failure_nullptrDestArray)
{
    struct private_ACUtilsTest_ADynArray_CharArray *arrayPtr = nullptr;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_insertArray(arrayPtr, 0, "012", 3), false);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
}